

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::Next
          (CopyingInputStreamAdaptor *this,void **data,int *size)

{
  CopyingInputStream *pCVar1;
  int iVar2;
  uchar *puVar3;
  int *size_local;
  void **data_local;
  CopyingInputStreamAdaptor *this_local;
  
  if ((this->failed_ & 1U) == 0) {
    AllocateBufferIfNeeded(this);
    if (this->backup_bytes_ < 1) {
      pCVar1 = this->copying_stream_;
      puVar3 = internal::scoped_array<unsigned_char>::get(&this->buffer_);
      iVar2 = (*pCVar1->_vptr_CopyingInputStream[2])(pCVar1,puVar3,(ulong)(uint)this->buffer_size_);
      this->buffer_used_ = iVar2;
      if (this->buffer_used_ < 1) {
        if (this->buffer_used_ < 0) {
          this->failed_ = true;
        }
        FreeBuffer(this);
        this_local._7_1_ = false;
      }
      else {
        this->position_ = (long)this->buffer_used_ + this->position_;
        *size = this->buffer_used_;
        puVar3 = internal::scoped_array<unsigned_char>::get(&this->buffer_);
        *data = puVar3;
        this_local._7_1_ = true;
      }
    }
    else {
      puVar3 = internal::scoped_array<unsigned_char>::get(&this->buffer_);
      *data = puVar3 + ((long)this->buffer_used_ - (long)this->backup_bytes_);
      *size = this->backup_bytes_;
      this->backup_bytes_ = 0;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CopyingInputStreamAdaptor::Next(const void** data, int* size) {
  if (failed_) {
    // Already failed on a previous read.
    return false;
  }

  AllocateBufferIfNeeded();

  if (backup_bytes_ > 0) {
    // We have data left over from a previous BackUp(), so just return that.
    *data = buffer_.get() + buffer_used_ - backup_bytes_;
    *size = backup_bytes_;
    backup_bytes_ = 0;
    return true;
  }

  // Read new data into the buffer.
  buffer_used_ = copying_stream_->Read(buffer_.get(), buffer_size_);
  if (buffer_used_ <= 0) {
    // EOF or read error.  We don't need the buffer anymore.
    if (buffer_used_ < 0) {
      // Read error (not EOF).
      failed_ = true;
    }
    FreeBuffer();
    return false;
  }
  position_ += buffer_used_;

  *size = buffer_used_;
  *data = buffer_.get();
  return true;
}